

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

void __thiscall CLayer::Print(CLayer *this,FILE *pFile,int iMode)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  CBoundary *pCVar6;
  char local_3d;
  int iOverFlow;
  int iMaxOF;
  int j;
  int i;
  int iMode_local;
  FILE *pFile_local;
  CLayer *this_local;
  
  if (pFile != (FILE *)0x0) {
    if ((iMode == 0) || (iMode == 0x20)) {
      iVar1 = GetOverFlow(this,0x40);
      uVar2 = GetOverFlow(this,0x400000);
      uVar3 = Z(this);
      iVar4 = IsHorizontal(this);
      local_3d = 'H';
      if (iVar4 == 0) {
        local_3d = 'V';
      }
      uVar5 = GetCapacity(this,0x40);
      fprintf((FILE *)pFile,"L%d(%c,%d):o(%3d,%3d)\n",(ulong)uVar3,(ulong)(uint)(int)local_3d,
              (ulong)uVar5,(ulong)uVar2,iVar1);
    }
    else if ((iMode == 0x40) || (iMode == 0x400)) {
      for (iMaxOF = 0; iMaxOF < this->m_iMaxBX; iMaxOF = iMaxOF + 1) {
        for (iOverFlow = 0; iOverFlow < this->m_iMaxBY; iOverFlow = iOverFlow + 1) {
          pCVar6 = GetBoundary(this,iMaxOF,iOverFlow);
          (*(pCVar6->super_CPoint).super_CObject._vptr_CObject[2])(pCVar6,pFile,(ulong)(uint)iMode);
        }
      }
    }
    else {
      if (iMode != 0x800) {
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.cpp"
                      ,0x167,"virtual void CLayer::Print(FILE *, int)");
      }
      for (iMaxOF = 0; iMaxOF < this->m_iMaxBX; iMaxOF = iMaxOF + 1) {
        for (iOverFlow = 0; iOverFlow < this->m_iMaxBY; iOverFlow = iOverFlow + 1) {
          pCVar6 = GetBoundary(this,iMaxOF,iOverFlow);
          (*(pCVar6->super_CPoint).super_CObject._vptr_CObject[2])(pCVar6,pFile,0x800);
          fprintf((FILE *)pFile,"\n");
        }
      }
    }
    fflush((FILE *)pFile);
  }
  return;
}

Assistant:

void CLayer::Print(FILE *pFile, int iMode)
{
	if(pFile==NULL)	return;

	int i,j;
	switch(iMode){
	case PRINT_MODE_CGDUMP:
		for (i=0;i<m_iMaxBX;++i)			
			for (j=0;j<m_iMaxBY;++j)
			{
				GetBoundary(i,j)->Print(pFile,iMode);
				fprintf(pFile,"\n");
			}				
			break;
	case PRINT_MODE_RESULT:
	case PRINT_MODE_OFDUMP:
		for (i=0;i<m_iMaxBX;++i)
			for (j=0;j<m_iMaxBY;++j)
				GetBoundary(i,j)->Print(pFile,iMode);
		break;
	case PRINT_MODE_TEXT:
	case PRINT_MODE_CONGET:
		{	
			int	iMaxOF		=	GetOverFlow(GET_MODE_MAX);
			int	iOverFlow	=	GetOverFlow(GET_MODE_SUM);

			fprintf(pFile,"L%d(%c,%d):o(%3d,%3d)\n",
				Z(),IsHorizontal()? 'H':'V',GetCapacity(GET_MODE_MAX),iOverFlow,iMaxOF);
		}
		break;
	default:
		assert(FALSE);
		break;
	}

	fflush(pFile);
}